

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowMetricsWindow::Funcs::NodeDrawList
               (ImGuiWindow *window,ImGuiViewportP *viewport,ImDrawList *draw_list,char *label)

{
  ulong uVar1;
  ImGuiWindow *pIVar2;
  float fVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ImDrawList *this;
  ImDrawCmd *pIVar7;
  ImDrawVert *pIVar8;
  int elem_offset;
  char *pcVar9;
  unsigned_short *puVar10;
  uint uVar11;
  ImDrawCmd *draw_cmd;
  char *pcVar12;
  int n;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  float fVar16;
  ulong local_1e8;
  ImVec2 triangle [3];
  ImVec2 local_190;
  ImVec2 triangle_1 [3];
  char buf [300];
  undefined1 local_3c [12];
  
  pcVar12 = "";
  if (draw_list->_OwnerName != (char *)0x0) {
    pcVar12 = draw_list->_OwnerName;
  }
  bVar4 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds","DrawList",pcVar12,
                   (ulong)(uint)(draw_list->VtxBuffer).Size,(ulong)(uint)(draw_list->IdxBuffer).Size
                   ,(draw_list->CmdBuffer).Size);
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->DrawList == draw_list) {
    SameLine(0.0,-1.0);
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = -0x80;
    buf[3] = '?';
    buf[4] = -0x33;
    buf[5] = -0x34;
    buf[6] = -0x34;
    buf[7] = '>';
    buf[8] = -0x33;
    buf[9] = -0x34;
    buf[10] = -0x34;
    buf[0xb] = '>';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = -0x80;
    buf[0xf] = '?';
    TextColored((ImVec4 *)buf,"CURRENTLY APPENDING");
    if (!bVar4) {
      return;
    }
    goto LAB_0013b256;
  }
  if (viewport == (ImGuiViewportP *)0x0) {
    bVar15 = false;
    this = (ImDrawList *)0x0;
LAB_0013b272:
    bVar5 = window != (ImGuiWindow *)0x0;
  }
  else {
    this = GetForegroundDrawList(&viewport->super_ImGuiViewport);
    bVar15 = this != (ImDrawList *)0x0;
    if (window == (ImGuiWindow *)0x0 || !bVar15) goto LAB_0013b272;
    bVar5 = IsItemHovered(0);
    bVar15 = true;
    if (bVar5) {
      buf._0_4_ = (window->Size).x + (window->Pos).x;
      buf._4_4_ = (window->Size).y + (window->Pos).y;
      ImDrawList::AddRect(this,&window->Pos,(ImVec2 *)buf,0xff00ffff,0.0,0xf,1.0);
    }
    bVar5 = true;
  }
  if (!bVar4) {
    return;
  }
  if ((bVar5) && (window->WasActive == false)) {
    TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");
  }
  pIVar7 = (draw_list->CmdBuffer).Data;
  local_1e8 = 0;
  for (draw_cmd = pIVar7; draw_cmd < pIVar7 + (draw_list->CmdBuffer).Size; draw_cmd = draw_cmd + 1)
  {
    elem_offset = (int)local_1e8;
    if (draw_cmd->UserCallback == (ImDrawCallback)0x0) {
      if (draw_cmd->ElemCount != 0) {
        if ((draw_list->IdxBuffer).Size < 1) {
          puVar10 = (unsigned_short *)0x0;
        }
        else {
          puVar10 = (draw_list->IdxBuffer).Data;
        }
        ImFormatString(buf,300,
                       "DrawCmd:%5d triangles, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                       SUB84((double)(draw_cmd->ClipRect).x,0),(double)(draw_cmd->ClipRect).y,
                       (double)(draw_cmd->ClipRect).z,(double)(draw_cmd->ClipRect).w,
                       (ulong)draw_cmd->ElemCount / 3,draw_cmd->TextureId);
        bVar4 = TreeNode((void *)(((long)draw_cmd - (long)(draw_list->CmdBuffer).Data) / 0x38),"%s",
                         buf);
        bVar5 = IsItemHovered(0);
        if (bVar5) {
          bVar5 = bVar15;
          if (show_drawcmd_mesh == false) {
            bVar5 = (bool)(bVar15 & show_drawcmd_aabb);
          }
          if (bVar5 != false) {
            NodeDrawCmdShowMeshAndBoundingBox
                      (this,draw_list,draw_cmd,elem_offset,show_drawcmd_mesh,
                       (bool)(show_drawcmd_aabb & 1));
          }
        }
        if (bVar4) {
          fVar16 = 0.0;
          for (; (uint)local_1e8 < elem_offset + draw_cmd->ElemCount; local_1e8 = local_1e8 + 3) {
            triangle[0].x = 0.0;
            triangle[0].y = 0.0;
            triangle[1].x = 0.0;
            triangle[1].y = 0.0;
            triangle[2].x = 0.0;
            triangle[2].y = 0.0;
            for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
              uVar11 = (uint)(local_1e8 + lVar13);
              if (puVar10 != (unsigned_short *)0x0) {
                uVar11 = (uint)puVar10[local_1e8 + lVar13 & 0xffffffff];
              }
              pIVar8 = ImVector<ImDrawVert>::operator[](&draw_list->VtxBuffer,uVar11);
              triangle[lVar13] = pIVar8->pos;
            }
            fVar16 = fVar16 + ABS((triangle[0].y - triangle[1].y) * triangle[2].x +
                                  (triangle[1].y - triangle[2].y) * triangle[0].x +
                                  (triangle[2].y - triangle[0].y) * triangle[1].x) * 0.5;
          }
          ImFormatString(buf,300,
                         "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px",
                         SUB84((double)fVar16,0),(ulong)draw_cmd->ElemCount,
                         (ulong)draw_cmd->VtxOffset);
          triangle[0].x = 0.0;
          triangle[0].y = 0.0;
          Selectable(buf,false,0,triangle);
          bVar4 = IsItemHovered(0);
          if ((bVar15 & bVar4) != 0) {
            NodeDrawCmdShowMeshAndBoundingBox(this,draw_list,draw_cmd,elem_offset,true,false);
          }
          triangle[1].x = (float)(draw_cmd->ElemCount / 3);
          triangle[2].y = (GImGui->CurrentWindow->DC).CursorPos.y;
          triangle[1].y = 0.0;
          triangle[2].x = -1.0;
          triangle[0].x = -NAN;
          triangle[0].y = 0.0;
          while (bVar4 = ImGuiListClipper::Step((ImGuiListClipper *)triangle), bVar4) {
            fVar3 = triangle[0].y;
            uVar14 = (ulong)(uint)((int)triangle[0].x * 3 + elem_offset);
            for (fVar16 = triangle[0].x; (int)fVar16 < (int)fVar3; fVar16 = (float)((int)fVar16 + 1)
                ) {
              triangle_1[0].x = 0.0;
              triangle_1[0].y = 0.0;
              triangle_1[1].x = 0.0;
              triangle_1[1].y = 0.0;
              triangle_1[2].x = 0.0;
              triangle_1[2].y = 0.0;
              pcVar12 = buf;
              for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
                uVar1 = (uVar14 & 0xffffffff) + lVar13;
                if (puVar10 == (unsigned_short *)0x0) {
                  uVar11 = (uint)uVar1;
                }
                else {
                  uVar11 = (uint)puVar10[(int)uVar14 + lVar13];
                }
                pIVar8 = ImVector<ImDrawVert>::operator[](&draw_list->VtxBuffer,uVar11);
                triangle_1[lVar13] = pIVar8->pos;
                pcVar9 = "     ";
                if (lVar13 == 0) {
                  pcVar9 = "Vert:";
                }
                iVar6 = ImFormatString(pcVar12,(size_t)(local_3c + -(long)pcVar12),
                                       "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                       SUB84((double)(pIVar8->pos).x,0),(double)(pIVar8->pos).y,
                                       (double)(pIVar8->uv).x,(double)(pIVar8->uv).y,pcVar9,
                                       uVar1 & 0xffffffff,(ulong)pIVar8->col);
                pcVar12 = pcVar12 + iVar6;
              }
              local_190.x = 0.0;
              local_190.y = 0.0;
              Selectable(buf,false,0,&local_190);
              if ((bVar15 != false) && (bVar4 = IsItemHovered(0), bVar4)) {
                uVar11 = this->Flags;
                this->Flags = uVar11 & 0xfffffffe;
                ImDrawList::AddPolyline(this,triangle_1,3,0xff00ffff,true,1.0);
                this->Flags = uVar11;
              }
              uVar14 = (uVar14 & 0xffffffff) + 3;
            }
          }
          TreePop();
          ImGuiListClipper::~ImGuiListClipper((ImGuiListClipper *)triangle);
        }
      }
    }
    else {
      BulletText("Callback %p, user_data %p",draw_cmd->UserCallback,draw_cmd->UserCallbackData);
    }
    local_1e8 = (ulong)(elem_offset + draw_cmd->ElemCount);
    pIVar7 = (draw_list->CmdBuffer).Data;
  }
LAB_0013b256:
  TreePop();
  return;
}

Assistant:

static void NodeDrawList(ImGuiWindow* window, ImGuiViewportP* viewport, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImVec4(1.0f, 0.4f, 0.4f, 1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* fg_draw_list = viewport ? GetForegroundDrawList(viewport) : NULL; // Render additional visuals into the top-most draw list
            if (window && fg_draw_list && ImGui::IsItemHovered())
                fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            if (window && !window->WasActive)
                ImGui::TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");

            unsigned int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }

                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                char buf[300];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "DrawCmd:%5d triangles, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                    pcmd->ElemCount / 3, (void*)(intptr_t)pcmd->TextureId,
                    pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
                if (ImGui::IsItemHovered() && (show_drawcmd_mesh || show_drawcmd_aabb) && fg_draw_list)
                    NodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, elem_offset, show_drawcmd_mesh, show_drawcmd_aabb);
                if (!pcmd_node_open)
                    continue;

                // Calculate approximate coverage area (touched pixel count)
                // This will be in pixels squared as long there's no post-scaling happening to the renderer output.
                float total_area = 0.0f;
                for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + pcmd->ElemCount); base_idx += 3)
                {
                    ImVec2 triangle[3];
                    for (int n = 0; n < 3; n++)
                        triangle[n] = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                    total_area += ImTriangleArea(triangle[0], triangle[1], triangle[2]);
                }

                // Display vertex information summary. Hover to get all triangles drawn in wire-frame
                ImFormatString(buf, IM_ARRAYSIZE(buf), "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px", pcmd->ElemCount, pcmd->VtxOffset, pcmd->IdxOffset, total_area);
                ImGui::Selectable(buf);
                if (ImGui::IsItemHovered() && fg_draw_list)
                    NodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, elem_offset, true, false);

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGuiListClipper clipper;
                clipper.Begin(pcmd->ElemCount / 3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, idx_i = elem_offset + clipper.DisplayStart * 3; prim < clipper.DisplayEnd; prim++)
                    {
                        char* buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangle[3];
                        for (int n = 0; n < 3; n++, idx_i++)
                        {
                            ImDrawVert& v = draw_list->VtxBuffer[idx_buffer ? idx_buffer[idx_i] : idx_i];
                            triangle[n] = v.pos;
                            buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                (n == 0) ? "Vert:" : "     ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }

                        ImGui::Selectable(buf, false);
                        if (fg_draw_list && ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = fg_draw_list->Flags;
                            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                            fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            fg_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }